

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void receive_particle_slice(int left,int width,int rank,int x_diff)

{
  int particles_to_receive;
  vector<particle,_std::allocator<particle>_> particles;
  vector<int,_std::allocator<int>_> particle_numbers;
  allocator_type local_6d;
  int local_6c;
  int local_68;
  int local_64;
  vector<particle,_std::allocator<particle>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_68 = left;
  local_64 = x_diff;
  MPI_Recv(&local_6c,1,&ompi_mpi_int,rank,0,&ompi_mpi_comm_world,0);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)nz_global * (long)width * (long)ny_global,(allocator_type *)&local_60);
  MPI_Recv(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,(ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2,&ompi_mpi_int,rank,1,
           &ompi_mpi_comm_world,0);
  std::vector<particle,_std::allocator<particle>_>::vector(&local_60,(long)local_6c,&local_6d);
  MPI_Recv(local_60.super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_start,local_6c,MPI_PARTICLE,rank,2,&ompi_mpi_comm_world,0);
  unpack_particle_slice(local_68,width,&local_48,&local_60,local_64);
  if (local_60.super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void receive_particle_slice(int left, int width, int rank, int x_diff) {
    int particles_to_receive;
    MPI_Recv(&particles_to_receive, 1, MPI_INT, rank, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

    vector<int> particle_numbers(width * ny_global * nz_global);
    MPI_Recv(&(particle_numbers[0]), particle_numbers.size(), MPI_INT, rank, 1, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

    vector<particle> particles(particles_to_receive);

    MPI_Recv(&(particles[0]), particles_to_receive, MPI_PARTICLE, rank, 2, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
    unpack_particle_slice(left, width, particle_numbers, particles, x_diff);
}